

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_sha1_perform_all_rounds(fio_sha1_s *s,uint8_t *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  
  uVar1 = (s->digest).i[0];
  uVar2 = (s->digest).i[1];
  uVar3 = (s->digest).i[2];
  uVar4 = (s->digest).i[3];
  uVar18 = *(uint *)buffer;
  uVar6 = *(uint *)(buffer + 4);
  uVar5 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar14 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  iVar15 = ((uVar3 ^ uVar4) & uVar2 ^ uVar4) + (uVar1 << 5 | uVar1 >> 0x1b) + (s->digest).i[4] +
           uVar5;
  uVar10 = uVar2 << 0x1e | uVar2 >> 2;
  uVar6 = iVar15 + 0x5a827999;
  iVar8 = ((uVar10 ^ uVar3) & uVar1 ^ uVar3) + uVar4 + uVar14 + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar23 = uVar1 << 0x1e | uVar1 >> 2;
  uVar18 = *(uint *)(buffer + 8);
  uVar16 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar8 + 0x5a827999;
  iVar15 = (0xa57d8666U - iVar15 & uVar10 | uVar6 & uVar23) + uVar16 + uVar3 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar7 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0xc);
  uVar9 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar15 + 0x5a827999;
  iVar8 = uVar10 + uVar9 + (0xa57d8666U - iVar8 & uVar23 | uVar18 & uVar7) +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = *(uint *)(buffer + 0x10);
  uVar12 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar8 + 0x5a827999;
  iVar15 = uVar23 + uVar12 + (0xa57d8666U - iVar15 & uVar7 | uVar6 & uVar19) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar10 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0x14);
  uVar11 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar15 + 0x5a827999;
  iVar8 = uVar7 + uVar11 + (0xa57d8666U - iVar8 & uVar19 | uVar18 & uVar10) +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar7 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = *(uint *)(buffer + 0x18);
  uVar24 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar8 + 0x5a827999;
  iVar15 = uVar19 + uVar24 + (0xa57d8666U - iVar15 & uVar10 | uVar6 & uVar7) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar19 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0x1c);
  uVar23 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar15 + 0x5a827999;
  iVar8 = uVar10 + uVar23 + (0xa57d8666U - iVar8 & uVar7 | uVar18 & uVar19) +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar25 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = *(uint *)(buffer + 0x20);
  uVar20 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar8 + 0x5a827999;
  iVar15 = uVar7 + uVar20 + (0xa57d8666U - iVar15 & uVar19 | uVar6 & uVar25) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar10 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0x24);
  uVar30 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar15 + 0x5a827999;
  iVar8 = uVar19 + uVar30 + (0xa57d8666U - iVar8 & uVar25 | uVar18 & uVar10) +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar7 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = *(uint *)(buffer + 0x28);
  uVar13 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar8 + 0x5a827999;
  iVar26 = uVar25 + uVar13 + (0xa57d8666U - iVar15 & uVar10 | uVar6 & uVar7) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar19 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0x2c);
  uVar21 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar26 + 0x5a827999;
  iVar15 = uVar10 + uVar21 + (0xa57d8666U - iVar8 & uVar7 | uVar18 & uVar19) +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar31 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = *(uint *)(buffer + 0x30);
  uVar17 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar15 + 0x5a827999;
  iVar8 = uVar7 + uVar17 + (0xa57d8666U - iVar26 & uVar19 | uVar6 & uVar31) +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar7 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0x34);
  uVar25 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar8 + 0x5a827999;
  iVar15 = uVar19 + uVar25 + (0xa57d8666U - iVar15 & uVar31 | uVar18 & uVar7) +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar10 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = *(uint *)(buffer + 0x38);
  uVar19 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
  uVar18 = iVar15 + 0x5a827999;
  iVar26 = uVar31 + uVar19 + (0xa57d8666U - iVar8 & uVar7 | uVar6 & uVar10) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar22 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = *(uint *)(buffer + 0x3c);
  uVar28 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = iVar26 + 0x5a827999;
  iVar8 = uVar7 + uVar28 + (0xa57d8666U - iVar15 & uVar10 | uVar18 & uVar22) +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar5 = uVar20 ^ uVar25 ^ uVar5 ^ uVar16;
  uVar7 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar27 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar18 = iVar8 + 0x5a827999;
  uVar31 = uVar6 * 0x40000000 | uVar6 >> 2;
  iVar15 = uVar10 + uVar27 + (0xa57d8666U - iVar26 & uVar22 | uVar6 & uVar7) +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar6 = uVar30 ^ uVar19 ^ uVar14 ^ uVar9;
  uVar32 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = iVar15 + 0x5a827999;
  iVar8 = uVar22 + uVar32 + (0xa57d8666U - iVar8 & uVar7 | uVar18 & uVar31) +
          (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar10 = uVar13 ^ uVar28 ^ uVar16 ^ uVar12;
  uVar5 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar33 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = iVar8 + 0x5a827999;
  uVar7 = uVar7 + uVar33 + (0xa57d8666U - iVar15 & uVar31 | uVar6 & uVar5) + 0x5a827999 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar10 = uVar9 ^ uVar11 ^ uVar21 ^ uVar27;
  uVar35 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar10 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar9 = uVar12 ^ uVar24 ^ uVar17 ^ uVar32;
  uVar29 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar12 = uVar31 + uVar35 + (0xa57d8666U - iVar8 & uVar5 | uVar18 & uVar6) + 0x5a827999 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar5 = uVar5 + uVar29 + (uVar10 ^ uVar6 ^ uVar7) + 0x6ed9eba1 + (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar9 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar18 = uVar11 ^ uVar23 ^ uVar25 ^ uVar33;
  uVar31 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar6 + uVar31 + (uVar9 ^ uVar10 ^ uVar12) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar11 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar6 = uVar24 ^ uVar20 ^ uVar19 ^ uVar35;
  uVar14 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar7 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = uVar23 ^ uVar30 ^ uVar28 ^ uVar29;
  uVar22 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar5 = uVar10 + uVar14 + (uVar11 ^ uVar9 ^ uVar5) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar6 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar9 + uVar22 + (uVar7 ^ uVar11 ^ uVar18) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar10 = uVar20 ^ uVar13 ^ uVar27 ^ uVar31;
  uVar16 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar23 = uVar11 + uVar16 + (uVar6 ^ uVar7 ^ uVar5) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar10 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar30 ^ uVar21 ^ uVar32 ^ uVar14;
  uVar30 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar5 = uVar7 + uVar30 + (uVar10 ^ uVar6 ^ uVar18) + 0x6ed9eba1 + (uVar23 * 0x20 | uVar23 >> 0x1b)
  ;
  uVar11 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar13 ^ uVar17 ^ uVar33 ^ uVar22;
  uVar34 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar12 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar18 = uVar21 ^ uVar25 ^ uVar35 ^ uVar16;
  uVar9 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar6 + uVar34 + (uVar11 ^ uVar10 ^ uVar23) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar6 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar10 + uVar9 + (uVar12 ^ uVar11 ^ uVar5) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar7 = uVar17 ^ uVar19 ^ uVar29 ^ uVar30;
  uVar23 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar11 + uVar23 + (uVar6 ^ uVar12 ^ uVar18) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = uVar25 ^ uVar28 ^ uVar31 ^ uVar34;
  uVar36 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar11 = uVar12 + uVar36 + (uVar18 ^ uVar6 ^ uVar5) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar10 = uVar19 ^ uVar27 ^ uVar14 ^ uVar9;
  uVar24 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar19 = uVar28 ^ uVar32 ^ uVar22 ^ uVar23;
  uVar17 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar6 = uVar6 + uVar24 + (uVar5 ^ uVar18 ^ uVar7) + 0x6ed9eba1 + (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar25 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar18 = uVar18 + uVar17 + (uVar10 ^ uVar5 ^ uVar11) + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b)
  ;
  uVar7 = uVar27 ^ uVar33 ^ uVar16 ^ uVar36;
  uVar19 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar5 = uVar5 + uVar19 + (uVar25 ^ uVar10 ^ uVar6) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = uVar32 ^ uVar35 ^ uVar30 ^ uVar24;
  uVar32 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar10 = uVar10 + uVar32 + (uVar6 ^ uVar25 ^ uVar18) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar7 = uVar33 ^ uVar29 ^ uVar34 ^ uVar17;
  uVar33 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar11 = uVar35 ^ uVar31 ^ uVar9 ^ uVar19;
  uVar20 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar5 = uVar25 + uVar33 + (uVar18 ^ uVar6 ^ uVar5) + 0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b)
  ;
  uVar11 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar6 = uVar6 + uVar20 + (uVar7 ^ uVar18 ^ uVar10) + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar10 = uVar29 ^ uVar14 ^ uVar23 ^ uVar32;
  uVar28 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = uVar18 + uVar28 + (uVar11 ^ uVar7 ^ uVar5) + 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar25 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar31 ^ uVar22 ^ uVar36 ^ uVar33;
  uVar13 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar7 = uVar7 + uVar13 + (uVar25 ^ uVar11 ^ uVar6) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar5 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = uVar14 ^ uVar16 ^ uVar24 ^ uVar20;
  uVar27 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = uVar22 ^ uVar30 ^ uVar17 ^ uVar28;
  uVar21 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = uVar11 + uVar27 + (uVar5 ^ uVar25 ^ uVar18) + 0x6ed9eba1 + (uVar7 * 0x20 | uVar7 >> 0x1b)
  ;
  uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar25 + uVar21 + (uVar6 ^ uVar5 ^ uVar7) + 0x6ed9eba1 + (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar11 = uVar16 ^ uVar34 ^ uVar19 ^ uVar13;
  uVar31 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar5 = uVar5 + uVar31 + (uVar10 & uVar6 | (uVar10 | uVar6) & uVar18) + -0x70e44324 +
          (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar25 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar30 ^ uVar9 ^ uVar32 ^ uVar27;
  uVar11 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar6 + uVar11 + (uVar25 & uVar10 | (uVar25 | uVar10) & uVar7) + -0x70e44324 +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar12 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar6 = uVar34 ^ uVar23 ^ uVar33 ^ uVar21;
  uVar29 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar7 = uVar10 + uVar29 + (uVar12 & uVar25 | (uVar12 | uVar25) & uVar5) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar6 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar5 = uVar9 ^ uVar36 ^ uVar20 ^ uVar31;
  uVar34 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar10 = uVar25 + uVar34 + (uVar6 & uVar12 | (uVar6 | uVar12) & uVar18) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar5 = uVar23 ^ uVar24 ^ uVar28 ^ uVar11;
  uVar9 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar23 = uVar12 + uVar9 + (uVar18 & uVar6 | (uVar18 | uVar6) & uVar7) + -0x70e44324 +
           (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar5 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar36 ^ uVar17 ^ uVar13 ^ uVar29;
  uVar22 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar6 = uVar6 + uVar22 + (uVar5 & uVar18 | (uVar5 | uVar18) & uVar10) + -0x70e44324 +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar7 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar10 = uVar24 ^ uVar19 ^ uVar27 ^ uVar34;
  uVar12 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = uVar18 + uVar12 + (uVar7 & uVar5 | (uVar7 | uVar5) & uVar23) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar10 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar23 = uVar17 ^ uVar32 ^ uVar21 ^ uVar9;
  uVar14 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar5 = uVar5 + uVar14 + (uVar10 & uVar7 | (uVar10 | uVar7) & uVar6) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar19 = uVar19 ^ uVar33 ^ uVar31 ^ uVar22;
  uVar30 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar7 = uVar7 + uVar30 + (uVar6 & uVar10 | (uVar6 | uVar10) & uVar18) + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = uVar32 ^ uVar20 ^ uVar11 ^ uVar12;
  uVar32 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar23 = uVar10 + uVar32 + (uVar18 & uVar6 | (uVar18 | uVar6) & uVar5) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar10 = uVar33 ^ uVar28 ^ uVar29 ^ uVar14;
  uVar24 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar6 = uVar6 + uVar24 + (uVar5 & uVar18 | (uVar5 | uVar18) & uVar7) + -0x70e44324 +
          (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar19 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar20 ^ uVar13 ^ uVar34 ^ uVar30;
  uVar10 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar18 = uVar18 + uVar10 + (uVar19 & uVar5 | (uVar19 | uVar5) & uVar23) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar7 = uVar28 ^ uVar27 ^ uVar9 ^ uVar32;
  uVar28 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar5 = uVar5 + uVar28 + (uVar23 & uVar19 | (uVar23 | uVar19) & uVar6) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar7 = uVar13 ^ uVar21 ^ uVar22 ^ uVar24;
  uVar13 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar19 + uVar13 + (uVar6 & uVar23 | (uVar6 | uVar23) & uVar18) + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = uVar27 ^ uVar31 ^ uVar12 ^ uVar10;
  uVar16 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar25 = uVar23 + uVar16 + (uVar18 & uVar6 | (uVar18 | uVar6) & uVar5) + -0x70e44324 +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar19 = uVar21 ^ uVar11 ^ uVar14 ^ uVar28;
  uVar17 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar6 = uVar6 + uVar17 + (uVar5 & uVar18 | (uVar5 | uVar18) & uVar7) + -0x70e44324 +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar23 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar31 ^ uVar29 ^ uVar30 ^ uVar13;
  uVar19 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar18 = uVar18 + uVar19 + (uVar23 & uVar5 | (uVar23 | uVar5) & uVar25) + -0x70e44324 +
           (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar7 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar11 = uVar11 ^ uVar34 ^ uVar32 ^ uVar16;
  uVar33 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar5 = uVar5 + uVar33 + (uVar7 & uVar23 | (uVar7 | uVar23) & uVar6) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar11 = uVar29 ^ uVar9 ^ uVar24 ^ uVar17;
  uVar35 = uVar11 << 1 | (uint)((int)uVar11 < 0);
  uVar11 = uVar23 + uVar35 + (uVar6 & uVar7 | (uVar6 | uVar7) & uVar18) + -0x70e44324 +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar23 = uVar34 ^ uVar22 ^ uVar10 ^ uVar19;
  uVar29 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar25 = uVar7 + uVar29 + (uVar18 & uVar6 | (uVar18 | uVar6) & uVar5) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = uVar9 ^ uVar12 ^ uVar28 ^ uVar33;
  uVar23 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar9 = uVar22 ^ uVar14 ^ uVar13 ^ uVar35;
  uVar20 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar6 = uVar6 + uVar23 + (uVar5 ^ uVar18 ^ uVar11) + -0x359d3e2a +
          (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar11 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar18 = uVar18 + uVar20 + (uVar7 ^ uVar5 ^ uVar25) + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b)
  ;
  uVar9 = uVar12 ^ uVar30 ^ uVar16 ^ uVar29;
  uVar36 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar5 = uVar5 + uVar36 + (uVar11 ^ uVar7 ^ uVar6) + -0x359d3e2a + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar6 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar9 = uVar14 ^ uVar32 ^ uVar17 ^ uVar23;
  uVar34 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar7 + uVar34 + (uVar6 ^ uVar11 ^ uVar18) + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar7 = uVar30 ^ uVar24 ^ uVar19 ^ uVar20;
  uVar21 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar7 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar25 = uVar32 ^ uVar10 ^ uVar33 ^ uVar36;
  uVar27 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar11 = uVar11 + uVar21 + (uVar18 ^ uVar6 ^ uVar5) + -0x359d3e2a + (uVar9 * 0x20 | uVar9 >> 0x1b)
  ;
  uVar25 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar6 = uVar6 + uVar27 + (uVar7 ^ uVar18 ^ uVar9) + -0x359d3e2a + (uVar11 * 0x20 | uVar11 >> 0x1b)
  ;
  uVar5 = uVar24 ^ uVar28 ^ uVar35 ^ uVar34;
  uVar9 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar18 = uVar18 + uVar9 + (uVar25 ^ uVar7 ^ uVar11) + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b)
  ;
  uVar12 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar5 = uVar10 ^ uVar13 ^ uVar29 ^ uVar21;
  uVar11 = uVar5 << 1 | (uint)((int)uVar5 < 0);
  uVar7 = uVar7 + uVar11 + (uVar12 ^ uVar25 ^ uVar6) + -0x359d3e2a +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar5 = uVar6 * 0x40000000 | uVar6 >> 2;
  uVar6 = uVar28 ^ uVar16 ^ uVar23 ^ uVar27;
  uVar22 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = uVar13 ^ uVar17 ^ uVar20 ^ uVar9;
  uVar14 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = uVar25 + uVar22 + (uVar5 ^ uVar12 ^ uVar18) + -0x359d3e2a +
           (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar10 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar7 = uVar12 + uVar14 + (uVar6 ^ uVar5 ^ uVar7) + -0x359d3e2a + (uVar18 * 0x20 | uVar18 >> 0x1b)
  ;
  uVar25 = uVar16 ^ uVar19 ^ uVar36 ^ uVar11;
  uVar13 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar5 = uVar5 + uVar13 + (uVar10 ^ uVar6 ^ uVar18) + -0x359d3e2a + (uVar7 * 0x20 | uVar7 >> 0x1b);
  uVar25 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar17 ^ uVar33 ^ uVar34 ^ uVar22;
  uVar31 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar6 + uVar31 + (uVar25 ^ uVar10 ^ uVar7) + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b)
  ;
  uVar12 = uVar7 * 0x40000000 | uVar7 >> 2;
  uVar6 = uVar19 ^ uVar35 ^ uVar21 ^ uVar14;
  uVar7 = uVar6 << 1 | (uint)((int)uVar6 < 0);
  uVar6 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar19 = uVar33 ^ uVar29 ^ uVar27 ^ uVar13;
  uVar19 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar5 = uVar10 + uVar7 + (uVar12 ^ uVar25 ^ uVar5) + -0x359d3e2a +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar10 = uVar25 + uVar19 + (uVar6 ^ uVar12 ^ uVar18) + -0x359d3e2a +
           (uVar5 * 0x20 | uVar5 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar9 = uVar35 ^ uVar23 ^ uVar9 ^ uVar31;
  uVar25 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar9 = uVar12 + uVar25 + (uVar18 ^ uVar6 ^ uVar5) + -0x359d3e2a +
          (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar7 = uVar29 ^ uVar20 ^ uVar11 ^ uVar7;
  uVar11 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar6 = uVar6 + uVar11 + (uVar5 ^ uVar18 ^ uVar10) + -0x359d3e2a + (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar19 = uVar23 ^ uVar36 ^ uVar22 ^ uVar19;
  uVar7 = uVar10 * 0x40000000 | uVar10 >> 2;
  uVar19 = uVar19 << 1 | (uint)((int)uVar19 < 0);
  uVar25 = uVar20 ^ uVar34 ^ uVar14 ^ uVar25;
  uVar10 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar18 = uVar18 + uVar19 + (uVar7 ^ uVar5 ^ uVar9) + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
  uVar9 = (uVar25 << 1 | (uint)((int)uVar25 < 0)) + uVar5 + (uVar10 ^ uVar7 ^ uVar6) + -0x359d3e2a +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar11 = uVar21 ^ uVar36 ^ uVar13 ^ uVar11;
  uVar5 = uVar6 * 0x40000000 | uVar6 >> 2;
  iVar8 = (uVar11 << 1 | (uint)((int)uVar11 < 0)) + uVar7 + (uVar5 ^ uVar10 ^ uVar18) +
          (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar6 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar19 = uVar27 ^ uVar34 ^ uVar31 ^ uVar19;
  (s->digest).i[4] = uVar5 + (s->digest).i[4];
  (s->digest).i[3] = uVar6 + uVar4;
  (s->digest).i[2] = (uVar9 * 0x40000000 | uVar9 >> 2) + uVar3;
  (s->digest).i[1] = uVar2 + iVar8 + 0xca62c1d6;
  uVar18 = iVar8 + 0xca62c1d6;
  (s->digest).i[0] =
       (uVar19 << 1 | (uint)((int)uVar19 < 0)) + uVar1 + uVar10 + (uVar6 ^ uVar5 ^ uVar9) +
       -0x359d3e2a + (uVar18 * 0x20 | uVar18 >> 0x1b);
  return;
}

Assistant:

static inline void fio_sha1_perform_all_rounds(fio_sha1_s *s,
                                               const uint8_t *buffer) {
  /* collect data */
  uint32_t a = s->digest.i[0];
  uint32_t b = s->digest.i[1];
  uint32_t c = s->digest.i[2];
  uint32_t d = s->digest.i[3];
  uint32_t e = s->digest.i[4];
  uint32_t t, w[16];
  /* copy data to words, performing byte swapping as needed */
  w[0] = fio_str2u32(buffer);
  w[1] = fio_str2u32(buffer + 4);
  w[2] = fio_str2u32(buffer + 8);
  w[3] = fio_str2u32(buffer + 12);
  w[4] = fio_str2u32(buffer + 16);
  w[5] = fio_str2u32(buffer + 20);
  w[6] = fio_str2u32(buffer + 24);
  w[7] = fio_str2u32(buffer + 28);
  w[8] = fio_str2u32(buffer + 32);
  w[9] = fio_str2u32(buffer + 36);
  w[10] = fio_str2u32(buffer + 40);
  w[11] = fio_str2u32(buffer + 44);
  w[12] = fio_str2u32(buffer + 48);
  w[13] = fio_str2u32(buffer + 52);
  w[14] = fio_str2u32(buffer + 56);
  w[15] = fio_str2u32(buffer + 60);
  /* perform rounds */
#undef perform_single_round
#define perform_single_round(num)                                              \
  t = fio_lrot32(a, 5) + e + w[num] + ((b & c) | ((~b) & d)) + 0x5A827999;     \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

#define perform_four_rounds(i)                                                 \
  perform_single_round(i);                                                     \
  perform_single_round(i + 1);                                                 \
  perform_single_round(i + 2);                                                 \
  perform_single_round(i + 3);

  perform_four_rounds(0);
  perform_four_rounds(4);
  perform_four_rounds(8);
  perform_four_rounds(12);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + ((b & c) | ((~b) & d)) + 0x5A827999;  \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

  perform_four_rounds(16);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + (b ^ c ^ d) + 0x6ED9EBA1;             \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

  perform_four_rounds(20);
  perform_four_rounds(24);
  perform_four_rounds(28);
  perform_four_rounds(32);
  perform_four_rounds(36);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + ((b & (c | d)) | (c & d)) +           \
      0x8F1BBCDC;                                                              \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;

  perform_four_rounds(40);
  perform_four_rounds(44);
  perform_four_rounds(48);
  perform_four_rounds(52);
  perform_four_rounds(56);
#undef perform_single_round
#define perform_single_round(i)                                                \
  w[(i)&15] = fio_lrot32((w[(i - 3) & 15] ^ w[(i - 8) & 15] ^                  \
                          w[(i - 14) & 15] ^ w[(i - 16) & 15]),                \
                         1);                                                   \
  t = fio_lrot32(a, 5) + e + w[(i)&15] + (b ^ c ^ d) + 0xCA62C1D6;             \
  e = d;                                                                       \
  d = c;                                                                       \
  c = fio_lrot32(b, 30);                                                       \
  b = a;                                                                       \
  a = t;
  perform_four_rounds(60);
  perform_four_rounds(64);
  perform_four_rounds(68);
  perform_four_rounds(72);
  perform_four_rounds(76);

  /* store data */
  s->digest.i[4] += e;
  s->digest.i[3] += d;
  s->digest.i[2] += c;
  s->digest.i[1] += b;
  s->digest.i[0] += a;
}